

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void MergeStyles(TidyDocImpl *doc,Node *node,Node *child)

{
  ctmbstr str;
  uint uVar1;
  uint uVar2;
  tmbstr s1;
  AttVal *pAVar3;
  tmbstr ptVar4;
  AttVal *pAVar5;
  AttVal *pAVar6;
  
  pAVar6 = (AttVal *)&child->attributes;
  ptVar4 = (ctmbstr)0x0;
  pAVar5 = pAVar6;
  do {
    pAVar5 = pAVar5->next;
    if (pAVar5 == (AttVal *)0x0) goto LAB_00139300;
  } while ((pAVar5->dict == (Attribute *)0x0) || (pAVar5->dict->id != TidyAttr_CLASS));
  ptVar4 = pAVar5->value;
LAB_00139300:
  pAVar5 = (AttVal *)&node->attributes;
  pAVar3 = pAVar5;
  do {
    pAVar3 = pAVar3->next;
    if (pAVar3 == (AttVal *)0x0) goto LAB_001393b6;
  } while ((pAVar3->dict == (Attribute *)0x0) || (pAVar3->dict->id != TidyAttr_CLASS));
  str = pAVar3->value;
  if (str == (ctmbstr)0x0) {
LAB_001393b6:
    if (ptVar4 != (ctmbstr)0x0) {
      pAVar3 = prvTidyNewAttributeEx(doc,"class",ptVar4,0x22);
      prvTidyInsertAttributeAtStart(node,pAVar3);
    }
  }
  else if (ptVar4 != (ctmbstr)0x0) {
    uVar1 = prvTidytmbstrlen(str);
    uVar2 = prvTidytmbstrlen(ptVar4);
    s1 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,(long)uVar1 + (long)uVar2 + 2);
    prvTidytmbstrcpy(s1,str);
    s1[uVar1] = ' ';
    prvTidytmbstrcpy(s1 + uVar1 + 1,ptVar4);
    (*doc->allocator->vtbl->free)(doc->allocator,pAVar3->value);
    pAVar3->value = s1;
  }
  ptVar4 = (ctmbstr)0x0;
  do {
    pAVar6 = pAVar6->next;
    if (pAVar6 == (AttVal *)0x0) goto LAB_001393fd;
  } while ((pAVar6->dict == (Attribute *)0x0) || (pAVar6->dict->id != TidyAttr_STYLE));
  ptVar4 = pAVar6->value;
LAB_001393fd:
  do {
    pAVar5 = pAVar5->next;
    if (pAVar5 == (AttVal *)0x0) goto LAB_00139447;
  } while ((pAVar5->dict == (Attribute *)0x0) || (pAVar5->dict->id != TidyAttr_STYLE));
  if (pAVar5->value == (ctmbstr)0x0) {
LAB_00139447:
    if (ptVar4 != (ctmbstr)0x0) {
      pAVar5 = prvTidyNewAttributeEx(doc,"style",ptVar4,0x22);
      prvTidyInsertAttributeAtStart(node,pAVar5);
      return;
    }
  }
  else if (ptVar4 != (ctmbstr)0x0) {
    ptVar4 = MergeProperties(doc,pAVar5->value,ptVar4);
    (*doc->allocator->vtbl->free)(doc->allocator,pAVar5->value);
    pAVar5->value = ptVar4;
  }
  return;
}

Assistant:

static void MergeStyles(TidyDocImpl* doc, Node *node, Node *child)
{
    AttVal *av;
    tmbstr s1, s2, style;

    /*
       the child may have a class attribute used
       for attaching styles, if so the class name
       needs to be copied to node's class
    */
    MergeClasses(doc, node, child);

    for (s2 = NULL, av = child->attributes; av; av = av->next)
    {
        if (attrIsSTYLE(av))
        {
            s2 = av->value;
            break;
        }
    }

    for (s1 = NULL, av = node->attributes; av; av = av->next)
    {
        if (attrIsSTYLE(av))
        {
            s1 = av->value;
            break;
        }
    }

    if (s1)
    {
        if (s2)  /* merge styles from both */
        {
            style = MergeProperties(doc, s1, s2);
            TidyDocFree(doc, av->value);
            av->value = style;
        }
    }
    else if (s2)  /* copy style of child */
    {
        av = TY_(NewAttributeEx)( doc, "style", s2, '"' );
        TY_(InsertAttributeAtStart)( node, av );
    }
}